

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::MessageOptions::InternalSerializeWithCachedSizesToArray
          (MessageOptions *this,bool deterministic,uint8 *target)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  Type *this_00;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  int index;
  byte *pbVar7;
  
  uVar6 = (this->_has_bits_).has_bits_[0];
  if ((uVar6 & 1) != 0) {
    bVar1 = this->message_set_wire_format_;
    *target = '\b';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar6 & 2) != 0) {
    bVar1 = this->no_standard_descriptor_accessor_;
    *target = '\x10';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar6 & 4) != 0) {
    bVar1 = this->deprecated_;
    *target = '\x18';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar6 & 8) != 0) {
    bVar1 = this->map_entry_;
    *target = '8';
    target[1] = bVar1;
    target = target + 2;
  }
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    index = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
      target[0] = 0xba;
      target[1] = '>';
      pbVar7 = target + 2;
      uVar6 = this_00->_cached_size_;
      uVar5 = uVar6;
      if (0x7f < uVar6) {
        do {
          *pbVar7 = (byte)uVar6 | 0x80;
          uVar5 = uVar6 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
      *pbVar7 = (byte)uVar5;
      target = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                         (this_00,false,pbVar7 + 1);
      index = index + 1;
    } while (index != iVar2);
  }
  puVar4 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,deterministic,target);
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),puVar4);
    return puVar4;
  }
  return puVar4;
}

Assistant:

::google::protobuf::uint8* MessageOptions::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MessageOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool message_set_wire_format = 1 [default = false];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(1, this->message_set_wire_format(), target);
  }

  // optional bool no_standard_descriptor_accessor = 2 [default = false];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->no_standard_descriptor_accessor(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->deprecated(), target);
  }

  // optional bool map_entry = 7;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->map_entry(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), deterministic, target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, deterministic, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MessageOptions)
  return target;
}